

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::DeferCall(cmMakefile *this,string *id,string *file,cmListFileFunction *lff)

{
  bool bVar1;
  pointer this_00;
  DeferCommand local_80;
  cmListFileFunction *local_30;
  cmListFileFunction *lff_local;
  string *file_local;
  string *id_local;
  cmMakefile *this_local;
  
  local_30 = lff;
  lff_local = (cmListFileFunction *)file;
  file_local = id;
  id_local = (string *)this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->Defer);
  if (bVar1) {
    this_00 = std::
              unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
              ::operator->(&this->Defer);
    std::__cxx11::string::string((string *)&local_80,(string *)id);
    std::__cxx11::string::string((string *)&local_80.FilePath,(string *)file);
    cmListFileFunction::cmListFileFunction(&local_80.Command,lff);
    std::vector<cmMakefile::DeferCommand,_std::allocator<cmMakefile::DeferCommand>_>::
    emplace_back<cmMakefile::DeferCommand>(&this_00->Commands,&local_80);
    DeferCommand::~DeferCommand(&local_80);
  }
  return bVar1;
}

Assistant:

bool cmMakefile::DeferCall(std::string id, std::string file,
                           cmListFileFunction lff)
{
  if (!this->Defer) {
    return false;
  }
  this->Defer->Commands.emplace_back(
    DeferCommand{ std::move(id), std::move(file), std::move(lff) });
  return true;
}